

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileConnections.hpp
# Opt level: O3

void helics::fileops::makeConnectionsToml<helics::CommonCore>(CommonCore *brk,string *file)

{
  basic_value<toml::type_config> *pbVar1;
  pointer pcVar2;
  size_type sVar3;
  _Hash_node_base *p_Var4;
  _Hash_node_base _Var5;
  bool bVar6;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar7;
  array_type *paVar8;
  string_type *psVar9;
  value_type *pvVar10;
  table_type *ptVar11;
  value *element;
  value *element_00;
  value *element_01;
  value *element_02;
  value *element_03;
  value *element_04;
  value *element_05;
  pointer this;
  basic_value<toml::type_config> *val_1;
  __node_base *p_Var12;
  basic_value<toml::type_config> *pbVar13;
  undefined8 uVar14;
  _Elt_pointer pAVar15;
  undefined8 uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  _Alloc_hider _Var18;
  string *in_R8;
  basic_value<toml::type_config> *val;
  string_view source;
  string_view source_00;
  string_view filter;
  string_view interfaceKey;
  string_view interfaceKey_00;
  string_view target;
  anon_class_16_2_4418202b callback;
  anon_class_16_2_4418055b callback_00;
  anon_class_16_2_4418055b callback_01;
  anon_class_16_2_4417f657 callback_02;
  anon_class_16_2_4417f657 callback_03;
  string_view dest;
  anon_class_16_2_4418202b callback_04;
  anon_class_16_2_4418055b callback_05;
  anon_class_16_2_4418055b callback_06;
  anon_class_16_2_4417f657 callback_07;
  anon_class_16_2_4417f657 callback_08;
  string_view endpoint;
  anon_class_16_2_d8a696df callback_09;
  anon_class_16_2_d8a696df callback_10;
  anon_class_16_2_d8a696df callback_11;
  anon_class_16_2_d8a696df callback_12;
  anon_class_16_2_d8a696df callback_13;
  string_view alias;
  string_view alias_00;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> aliases;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> globals;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> filts;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> lnks;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> conns;
  value doc;
  value uVal;
  key_type local_7d0;
  undefined1 *local_7b0;
  undefined8 local_7a8;
  undefined1 local_7a0;
  undefined7 uStack_79f;
  undefined1 local_790 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_780 [3];
  region local_748;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_6e0;
  undefined1 local_6c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8 [3];
  region local_680;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_618;
  undefined1 local_600 [48];
  undefined1 local_5d0 [32];
  undefined8 local_5b0 [2];
  undefined1 local_5a0 [48];
  undefined1 local_570 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_550;
  undefined1 local_540 [48];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  __atomic_float<double> local_4f0 [2];
  _Alloc_hider local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4c0;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  undefined8 local_450 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  undefined8 local_420;
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408 [3];
  region local_3d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_368;
  undefined1 local_350 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340 [3];
  region local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_2a0;
  value local_288;
  basic_value<toml::type_config> local_1c0;
  basic_value<toml::type_config> local_f8;
  
  toml::basic_value<toml::type_config>::basic_value(&local_f8);
  toml::basic_value<toml::type_config>::basic_value(&local_1c0);
  loadToml(&local_288,file);
  pbVar13 = &local_288;
  toml::basic_value<toml::type_config>::operator=(&local_1c0,pbVar13);
  toml::basic_value<toml::type_config>::cleanup(&local_288,(EVP_PKEY_CTX *)pbVar13);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288.comments_);
  toml::detail::region::~region(&local_288.region_);
  peVar7 = toml::find_or<toml::type_config,char[12]>(&local_1c0,(char (*) [12])0x3e9ef4,&local_f8);
  toml::basic_value<toml::type_config>::basic_value(&local_288,peVar7);
  if (local_288.type_ != empty) {
    paVar8 = toml::basic_value<toml::type_config>::as_array(&local_288);
    pbVar1 = (paVar8->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar13 = (paVar8->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
        pbVar13 = pbVar13 + 1) {
      if (pbVar13->type_ == array) {
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
        pcVar2 = (psVar9->_M_dataplus)._M_p;
        sVar3 = psVar9->_M_string_length;
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
        in_R8 = (string *)(psVar9->_M_dataplus)._M_p;
        source._M_str = pcVar2;
        source._M_len = sVar3;
        target._M_str = (char *)in_R8;
        target._M_len = psVar9->_M_string_length;
        CommonCore::dataLink(brk,source,target);
      }
      else {
        local_418._0_8_ = local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"publication","");
        local_6c8._0_8_ = local_6b8;
        local_6c8._8_8_ = 0;
        local_6b8[0]._M_local_buf[0] = '\0';
        bVar6 = toml::basic_value<toml::type_config>::contains(pbVar13,(key_type *)local_418);
        if (bVar6) {
          pvVar10 = toml::basic_value<toml::type_config>::at(pbVar13,(key_type *)local_418);
          tomlAsString_abi_cxx11_((string *)local_350,(fileops *)pvVar10,element);
        }
        else {
          local_350._0_8_ = local_340;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_350,local_6b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c8._0_8_ != local_6b8) {
          operator_delete((void *)local_6c8._0_8_,
                          CONCAT71(local_6b8[0]._M_allocated_capacity._1_7_,
                                   local_6b8[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._0_8_ != local_408) {
          operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
        }
        if (local_350._8_8_ == 0) {
          local_6c8._0_8_ = local_6b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"input","");
          local_790._0_8_ = local_780;
          local_790._8_8_ = (_func_int **)0x0;
          local_780[0]._M_local_buf[0] = '\0';
          bVar6 = toml::basic_value<toml::type_config>::contains(pbVar13,(key_type *)local_6c8);
          if (bVar6) {
            pvVar10 = toml::basic_value<toml::type_config>::at(pbVar13,(key_type *)local_6c8);
            tomlAsString_abi_cxx11_((string *)local_418,(fileops *)pvVar10,element_00);
          }
          else {
            local_418._0_8_ = local_408;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_418,local_780);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_790._0_8_ != local_780) {
            operator_delete((void *)local_790._0_8_,
                            CONCAT71(local_780[0]._M_allocated_capacity._1_7_,
                                     local_780[0]._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8._0_8_ != local_6b8) {
            operator_delete((void *)local_6c8._0_8_,
                            CONCAT71(local_6b8[0]._M_allocated_capacity._1_7_,
                                     local_6b8[0]._M_local_buf[0]) + 1);
          }
          if ((_func_int **)local_418._8_8_ == (_func_int **)0x0) {
            local_790._0_8_ = local_780;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"endpoint","");
            local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
            local_7d0._M_string_length = 0;
            local_7d0.field_2._M_local_buf[0] = '\0';
            bVar6 = toml::basic_value<toml::type_config>::contains(pbVar13,(key_type *)local_790);
            if (bVar6) {
              pvVar10 = toml::basic_value<toml::type_config>::at(pbVar13,(key_type *)local_790);
              tomlAsString_abi_cxx11_((string *)local_6c8,(fileops *)pvVar10,element_01);
            }
            else {
              local_6c8._0_8_ = local_6b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_6c8,&local_7d0.field_2);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
              operator_delete(local_7d0._M_dataplus._M_p,
                              CONCAT71(local_7d0.field_2._M_allocated_capacity._1_7_,
                                       local_7d0.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_790._0_8_ != local_780) {
              operator_delete((void *)local_790._0_8_,
                              CONCAT71(local_780[0]._M_allocated_capacity._1_7_,
                                       local_780[0]._M_local_buf[0]) + 1);
            }
            if (local_6c8._8_8_ != 0) {
              local_4a0._0_8_ = (long)local_4a0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"targets","");
              callback_02.ept = in_R8;
              callback_02.brk = (CommonCore *)local_6c8;
              addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_4_>
                        ((helics *)pbVar13,(value *)local_4a0,(string *)brk,callback_02);
              if (local_4a0._0_8_ != (long)local_4a0 + 0x10) {
                operator_delete((void *)local_4a0._0_8_,(ulong)(local_4a0._16_8_ + 1));
              }
              local_4c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"sources","");
              callback_03.ept = in_R8;
              callback_03.brk = (CommonCore *)local_6c8;
              addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_5_>
                        ((helics *)pbVar13,(value *)&local_4c0,(string *)brk,callback_03);
              if (local_4c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0) {
                operator_delete(local_4c0._M_pi,local_4b0._0_8_ + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6c8._0_8_ != local_6b8) {
              uVar14 = (pointer)CONCAT71(local_6b8[0]._M_allocated_capacity._1_7_,
                                         local_6b8[0]._M_local_buf[0]);
              uVar16 = local_6c8._0_8_;
              goto LAB_002c2d2f;
            }
          }
          else {
            local_460._M_allocated_capacity = (size_type)local_450;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"targets","");
            callback_00.ipt = in_R8;
            callback_00.brk = (CommonCore *)local_418;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_2_>
                      ((helics *)pbVar13,(value *)&local_460,(string *)brk,callback_00);
            if ((undefined8 *)local_460._M_allocated_capacity != local_450) {
              operator_delete((void *)local_460._M_allocated_capacity,(ulong)(local_450[0] + 1));
            }
            local_480._M_allocated_capacity = (size_type)&local_470;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"sources","");
            callback_01.ipt = in_R8;
            callback_01.brk = (CommonCore *)local_418;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_3_>
                      ((helics *)pbVar13,(value *)&local_480,(string *)brk,callback_01);
            uVar14 = local_470._M_allocated_capacity;
            uVar16 = local_480._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_allocated_capacity != &local_470) {
LAB_002c2d2f:
              operator_delete((void *)uVar16,(ulong)(uVar14 + 1));
            }
          }
          uVar14 = local_408[0]._M_allocated_capacity;
          _Var18._M_p = (pointer)local_418._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._0_8_ != local_408) goto LAB_002c2d54;
        }
        else {
          local_440._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_430;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"targets","");
          callback.pub = in_R8;
          callback.brk = (CommonCore *)local_350;
          addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_>
                    ((helics *)pbVar13,(value *)&local_440,(string *)brk,callback);
          uVar14 = local_430._M_allocated_capacity;
          _Var18._M_p = (pointer)local_440._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_pi != &local_430) {
LAB_002c2d54:
            operator_delete(_Var18._M_p,uVar14 + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._0_8_ != local_340) {
          operator_delete((void *)local_350._0_8_,local_340[0]._M_allocated_capacity + 1);
        }
      }
    }
  }
  peVar7 = toml::find_or<toml::type_config,char[6]>(&local_1c0,(char (*) [6])"links",&local_f8);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_350,peVar7);
  if (local_350[0] != '\0') {
    paVar8 = toml::basic_value<toml::type_config>::as_array
                       ((basic_value<toml::type_config> *)local_350);
    pbVar1 = (paVar8->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar13 = (paVar8->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
        pbVar13 = pbVar13 + 1) {
      if (pbVar13->type_ == array) {
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
        pcVar2 = (psVar9->_M_dataplus)._M_p;
        sVar3 = psVar9->_M_string_length;
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
        in_R8 = (string *)(psVar9->_M_dataplus)._M_p;
        source_00._M_str = pcVar2;
        source_00._M_len = sVar3;
        dest._M_str = (char *)in_R8;
        dest._M_len = psVar9->_M_string_length;
        CommonCore::linkEndpoints(brk,source_00,dest);
      }
      else {
        local_6c8._0_8_ = local_6b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"publication","");
        local_790._0_8_ = local_780;
        local_790._8_8_ = (_func_int **)0x0;
        local_780[0]._M_local_buf[0] = '\0';
        bVar6 = toml::basic_value<toml::type_config>::contains(pbVar13,(key_type *)local_6c8);
        if (bVar6) {
          pvVar10 = toml::basic_value<toml::type_config>::at(pbVar13,(key_type *)local_6c8);
          tomlAsString_abi_cxx11_((string *)local_418,(fileops *)pvVar10,element_02);
        }
        else {
          local_418._0_8_ = local_408;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_418,local_780);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_790._0_8_ != local_780) {
          operator_delete((void *)local_790._0_8_,
                          CONCAT71(local_780[0]._M_allocated_capacity._1_7_,
                                   local_780[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c8._0_8_ != local_6b8) {
          operator_delete((void *)local_6c8._0_8_,
                          CONCAT71(local_6b8[0]._M_allocated_capacity._1_7_,
                                   local_6b8[0]._M_local_buf[0]) + 1);
        }
        if ((_func_int **)local_418._8_8_ == (_func_int **)0x0) {
          local_790._0_8_ = local_780;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"input","");
          local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
          local_7d0._M_string_length = 0;
          local_7d0.field_2._M_local_buf[0] = '\0';
          bVar6 = toml::basic_value<toml::type_config>::contains(pbVar13,(key_type *)local_790);
          if (bVar6) {
            pvVar10 = toml::basic_value<toml::type_config>::at(pbVar13,(key_type *)local_790);
            tomlAsString_abi_cxx11_((string *)local_6c8,(fileops *)pvVar10,element_03);
          }
          else {
            local_6c8._0_8_ = local_6b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,&local_7d0.field_2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
            operator_delete(local_7d0._M_dataplus._M_p,
                            CONCAT71(local_7d0.field_2._M_allocated_capacity._1_7_,
                                     local_7d0.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_790._0_8_ != local_780) {
            operator_delete((void *)local_790._0_8_,
                            CONCAT71(local_780[0]._M_allocated_capacity._1_7_,
                                     local_780[0]._M_local_buf[0]) + 1);
          }
          if (local_6c8._8_8_ == 0) {
            local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"endpoint","");
            local_7b0 = &local_7a0;
            local_7a8 = 0;
            local_7a0 = 0;
            bVar6 = toml::basic_value<toml::type_config>::contains(pbVar13,&local_7d0);
            if (bVar6) {
              pvVar10 = toml::basic_value<toml::type_config>::at(pbVar13,&local_7d0);
              tomlAsString_abi_cxx11_((string *)local_790,(fileops *)pvVar10,element_04);
            }
            else {
              local_790._0_8_ = local_780;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_790,&local_7a0);
            }
            if (local_7b0 != &local_7a0) {
              operator_delete(local_7b0,CONCAT71(uStack_79f,local_7a0) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
              operator_delete(local_7d0._M_dataplus._M_p,
                              CONCAT71(local_7d0.field_2._M_allocated_capacity._1_7_,
                                       local_7d0.field_2._M_local_buf[0]) + 1);
            }
            if ((_func_int **)local_790._8_8_ != (_func_int **)0x0) {
              local_540._0_8_ = local_540 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"targets","");
              callback_07.ept = in_R8;
              callback_07.brk = (CommonCore *)local_790;
              addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_9_>
                        ((helics *)pbVar13,(value *)local_540,(string *)brk,callback_07);
              if ((undefined1 *)local_540._0_8_ != local_540 + 0x10) {
                operator_delete((void *)local_540._0_8_,(ulong)(local_540._16_8_ + 1));
              }
              local_570._16_8_ = &local_550;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(local_570 + 0x10),"sources","");
              callback_08.ept = in_R8;
              callback_08.brk = (CommonCore *)local_790;
              addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_10_>
                        ((helics *)pbVar13,(value *)(local_570 + 0x10),(string *)brk,callback_08);
              if ((pointer)local_570._16_8_ != (pointer)&local_550) {
                operator_delete((void *)local_570._16_8_,
                                (ulong)((long)&((_Alloc_hider *)
                                               &(local_550._M_pi)->_vptr__Sp_counted_base)->_M_p + 1
                                       ));
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_790._0_8_ != local_780) {
              pAVar15 = (_Elt_pointer)
                        CONCAT71(local_780[0]._M_allocated_capacity._1_7_,
                                 local_780[0]._M_local_buf[0]);
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_790._0_8_;
              goto LAB_002c32c1;
            }
          }
          else {
            local_500._0_8_ = local_500 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"targets","");
            callback_05.ipt = in_R8;
            callback_05.brk = (CommonCore *)local_6c8;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_7_>
                      ((helics *)pbVar13,(value *)local_500,(string *)brk,callback_05);
            if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
              operator_delete((void *)local_500._0_8_,(long)local_4f0[0]._M_fp + 1);
            }
            local_540._32_8_ = local_510;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_540 + 0x20),"sources","");
            callback_06.ipt = in_R8;
            callback_06.brk = (CommonCore *)local_6c8;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_8_>
                      ((helics *)pbVar13,(value *)(local_540 + 0x20),(string *)brk,callback_06);
            pAVar15 = (_Elt_pointer)local_510._0_8_;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_540._32_8_;
            if ((undefined1 *)local_540._32_8_ != local_510) {
LAB_002c32c1:
              operator_delete(paVar17,(ulong)((long)&pAVar15->messageAction + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8._0_8_ != local_6b8) {
            uVar14 = CONCAT71(local_6b8[0]._M_allocated_capacity._1_7_,local_6b8[0]._M_local_buf[0])
            ;
            _Var18._M_p = (pointer)local_6c8._0_8_;
            goto LAB_002c32e6;
          }
        }
        else {
          local_4e0._M_p = (pointer)&local_4d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_500 + 0x20),"targets","")
          ;
          callback_04.pub = in_R8;
          callback_04.brk = (CommonCore *)local_418;
          addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_6_>
                    ((helics *)pbVar13,(value *)(local_500 + 0x20),(string *)brk,callback_04);
          uVar14 = local_4d0._M_allocated_capacity;
          _Var18._M_p = local_4e0._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_p != &local_4d0) {
LAB_002c32e6:
            operator_delete(_Var18._M_p,uVar14 + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._0_8_ != local_408) {
          operator_delete((void *)local_418._0_8_,local_408[0]._M_allocated_capacity + 1);
        }
      }
    }
  }
  peVar7 = toml::find_or<toml::type_config,char[8]>(&local_1c0,(char (*) [8])0x3efcee,&local_f8);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_418,peVar7);
  if (local_418[0] != basic) {
    paVar8 = toml::basic_value<toml::type_config>::as_array
                       ((basic_value<toml::type_config> *)local_418);
    this = (paVar8->
           super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    local_420 = (paVar8->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (this != (pointer)local_420) {
      do {
        if (this->type_ == array) {
          paVar8 = toml::basic_value<toml::type_config>::as_array(this);
          psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                             ((paVar8->
                              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
          pcVar2 = (psVar9->_M_dataplus)._M_p;
          sVar3 = psVar9->_M_string_length;
          psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                             ((paVar8->
                              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1);
          in_R8 = (string *)(psVar9->_M_dataplus)._M_p;
          filter._M_str = pcVar2;
          filter._M_len = sVar3;
          endpoint._M_str = (char *)in_R8;
          endpoint._M_len = psVar9->_M_string_length;
          CommonCore::addSourceFilterToEndpoint(brk,filter,endpoint);
        }
        else {
          local_790._0_8_ = local_780;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"filter","");
          local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
          local_7d0._M_string_length = 0;
          local_7d0.field_2._M_local_buf[0] = '\0';
          bVar6 = toml::basic_value<toml::type_config>::contains(this,(key_type *)local_790);
          if (bVar6) {
            pvVar10 = toml::basic_value<toml::type_config>::at(this,(key_type *)local_790);
            tomlAsString_abi_cxx11_((string *)local_6c8,(fileops *)pvVar10,element_05);
          }
          else {
            local_6c8._0_8_ = local_6b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,&local_7d0.field_2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
            operator_delete(local_7d0._M_dataplus._M_p,
                            CONCAT71(local_7d0.field_2._M_allocated_capacity._1_7_,
                                     local_7d0.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_790._0_8_ != local_780) {
            operator_delete((void *)local_790._0_8_,
                            CONCAT71(local_780[0]._M_allocated_capacity._1_7_,
                                     local_780[0]._M_local_buf[0]) + 1);
          }
          if (local_6c8._8_8_ != 0) {
            local_600._32_8_ = local_5d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_600 + 0x20),"endpoints","");
            callback_09.fname = in_R8;
            callback_09.brk = (CommonCore *)local_6c8;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                      ((helics *)this,(value *)(local_600 + 0x20),(string *)brk,callback_09);
            if ((undefined1 *)local_600._32_8_ != local_5d0) {
              operator_delete((void *)local_600._32_8_,local_5d0._0_8_ + 1);
            }
            local_600._0_8_ = local_600 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_600,"source_endpoints","");
            callback_10.fname = in_R8;
            callback_10.brk = (CommonCore *)local_6c8;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                      ((helics *)this,(value *)local_600,(string *)brk,callback_10);
            if ((undefined1 *)local_600._0_8_ != local_600 + 0x10) {
              operator_delete((void *)local_600._0_8_,(ulong)(local_600._16_8_ + 1));
            }
            local_5a0._32_8_ = local_570;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_5a0 + 0x20),"sourceEndpoints","");
            callback_11.fname = in_R8;
            callback_11.brk = (CommonCore *)local_6c8;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                      ((helics *)this,(value *)(local_5a0 + 0x20),(string *)brk,callback_11);
            if ((pointer)local_5a0._32_8_ != (pointer)local_570) {
              operator_delete((void *)local_5a0._32_8_,(ulong)(local_570._0_8_ + 1));
            }
            local_5a0._0_8_ = local_5a0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"dest_endpoints","")
            ;
            callback_12.fname = in_R8;
            callback_12.brk = (CommonCore *)local_6c8;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_12_>
                      ((helics *)this,(value *)local_5a0,(string *)brk,callback_12);
            if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
              operator_delete((void *)local_5a0._0_8_,(ulong)(local_5a0._16_8_ + 1));
            }
            local_5d0._16_8_ = local_5b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_5d0 + 0x10),"destEndpoints","");
            callback_13.fname = in_R8;
            callback_13.brk = (CommonCore *)local_6c8;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_12_>
                      ((helics *)this,(value *)(local_5d0 + 0x10),(string *)brk,callback_13);
            if ((undefined8 *)local_5d0._16_8_ != local_5b0) {
              operator_delete((void *)local_5d0._16_8_,
                              (ulong)((long)&((__pthread_internal_list *)local_5b0[0])->__prev + 1))
              ;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8._0_8_ != local_6b8) {
            operator_delete((void *)local_6c8._0_8_,
                            CONCAT71(local_6b8[0]._M_allocated_capacity._1_7_,
                                     local_6b8[0]._M_local_buf[0]) + 1);
          }
        }
        this = this + 1;
      } while (this != (pointer)local_420);
    }
  }
  peVar7 = toml::find_or<toml::type_config,char[8]>(&local_1c0,(char (*) [8])"globals",&local_f8);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_6c8,peVar7);
  if (local_6c8[0] != '\0') {
    if (local_6c8[0] == '\t') {
      paVar8 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_6c8);
      pbVar1 = (paVar8->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar13 = (paVar8->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
          pbVar13 = pbVar13 + 1) {
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
        pcVar2 = (psVar9->_M_dataplus)._M_p;
        sVar3 = psVar9->_M_string_length;
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
        (*(brk->super_Core)._vptr_Core[0x5a])
                  (brk,sVar3,pcVar2,psVar9->_M_string_length,(psVar9->_M_dataplus)._M_p);
      }
    }
    else {
      ptVar11 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_
                          ((basic_value<toml::type_config> *)local_6c8);
      p_Var12 = &(ptVar11->_M_h)._M_before_begin;
      while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
        _Var5._M_nxt = p_Var12[1]._M_nxt;
        p_Var4 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var12 + 2))->_M_max_load_factor;
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((basic_value<toml::type_config> *)(p_Var12 + 5));
        (*(brk->super_Core)._vptr_Core[0x5a])
                  (brk,p_Var4,_Var5._M_nxt,psVar9->_M_string_length,(psVar9->_M_dataplus)._M_p);
      }
    }
  }
  peVar7 = toml::find_or<toml::type_config,char[8]>(&local_1c0,(char (*) [8])"aliases",&local_f8);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_790,peVar7);
  if (local_790[0] != empty) {
    if (local_790[0] == array) {
      paVar8 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_790);
      pbVar1 = (paVar8->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar13 = (paVar8->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
          pbVar13 = pbVar13 + 1) {
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
        pcVar2 = (psVar9->_M_dataplus)._M_p;
        peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                  *)psVar9->_M_string_length;
        paVar8 = toml::basic_value<toml::type_config>::as_array(pbVar13);
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar8->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
        interfaceKey._M_str = pcVar2;
        interfaceKey._M_len = (size_t)peVar7;
        alias._M_str = (psVar9->_M_dataplus)._M_p;
        alias._M_len = psVar9->_M_string_length;
        CommonCore::addAlias(brk,interfaceKey,alias);
      }
    }
    else {
      ptVar11 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_
                          ((basic_value<toml::type_config> *)local_790);
      p_Var12 = &(ptVar11->_M_h)._M_before_begin;
      while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
        _Var5._M_nxt = p_Var12[1]._M_nxt;
        peVar7 = *(enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                   **)&((_Prime_rehash_policy *)(p_Var12 + 2))->_M_max_load_factor;
        psVar9 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((basic_value<toml::type_config> *)(p_Var12 + 5));
        interfaceKey_00._M_str = (char *)_Var5._M_nxt;
        interfaceKey_00._M_len = (size_t)peVar7;
        alias_00._M_str = (psVar9->_M_dataplus)._M_p;
        alias_00._M_len = psVar9->_M_string_length;
        CommonCore::addAlias(brk,interfaceKey_00,alias_00);
      }
    }
  }
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_790,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_6e0);
  toml::detail::region::~region(&local_748);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_6c8,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_618);
  toml::detail::region::~region(&local_680);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_418,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_368);
  toml::detail::region::~region(&local_3d0);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_350,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_2a0);
  toml::detail::region::~region(&local_308);
  toml::basic_value<toml::type_config>::cleanup(&local_288,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288.comments_);
  toml::detail::region::~region(&local_288.region_);
  toml::basic_value<toml::type_config>::cleanup(&local_1c0,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1c0.comments_);
  toml::detail::region::~region(&local_1c0.region_);
  toml::basic_value<toml::type_config>::cleanup(&local_f8,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8.comments_);
  toml::detail::region::~region(&local_f8.region_);
  return;
}

Assistant:

void makeConnectionsToml(brkX* brk, const std::string& file)
{
    toml::value uVal;
    static_assert(std::is_base_of<Broker, brkX>::value || std::is_base_of<Core, brkX>::value,
                  "broker must be Core or broker");
    toml::value doc;
    try {
        doc = loadToml(file);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }

    auto conns = toml::find_or(doc, "connections", uVal);
    if (!conns.is_empty()) {
        auto& connArray = conns.as_array();
        for (const auto& conn : connArray) {
            if (conn.is_array()) {
                auto& connAct = conn.as_array();
                brk->dataLink(connAct[0].as_string(), connAct[1].as_string());
            } else {
                std::string pub = getOrDefault(conn, "publication", std::string());
                if (!pub.empty()) {
                    addTargets(conn, "targets", [brk, &pub](const std::string& target) {
                        brk->dataLink(pub, target);
                    });
                } else {
                    std::string ipt = getOrDefault(conn, "input", std::string());
                    if (!ipt.empty()) {
                        addTargets(conn, "targets", [brk, &ipt](const std::string& target) {
                            brk->dataLink(target, ipt);
                        });
                        addTargets(conn, "sources", [brk, &ipt](const std::string& source) {
                            brk->dataLink(source, ipt);
                        });
                    } else {
                        std::string ept = getOrDefault(conn, "endpoint", std::string());
                        if (!ept.empty()) {
                            addTargets(conn, "targets", [brk, &ept](const std::string& target) {
                                brk->linkEndpoints(ept, target);
                            });
                            addTargets(conn, "sources", [brk, &ept](const std::string& source) {
                                brk->linkEndpoints(source, ept);
                            });
                        }
                    }
                }
            }
        }
    }
    auto lnks = toml::find_or(doc, "links", uVal);
    if (!lnks.is_empty()) {
        auto& connArray = lnks.as_array();
        for (const auto& conn : connArray) {
            if (conn.is_array()) {
                auto& connAct = conn.as_array();
                brk->linkEndpoints(connAct[0].as_string(), connAct[1].as_string());
            } else {
                std::string pub = getOrDefault(conn, "publication", std::string());
                if (!pub.empty()) {
                    addTargets(conn, "targets", [brk, &pub](const std::string& target) {
                        brk->dataLink(pub, target);
                    });
                } else {
                    std::string ipt = getOrDefault(conn, "input", std::string());
                    if (!ipt.empty()) {
                        addTargets(conn, "targets", [brk, &ipt](const std::string& target) {
                            brk->dataLink(target, ipt);
                        });
                        addTargets(conn, "sources", [brk, &ipt](const std::string& source) {
                            brk->dataLink(source, ipt);
                        });
                    } else {
                        std::string ept = getOrDefault(conn, "endpoint", std::string());
                        if (!ept.empty()) {
                            addTargets(conn, "targets", [brk, &ept](const std::string& target) {
                                brk->linkEndpoints(ept, target);
                            });
                            addTargets(conn, "sources", [brk, &ept](const std::string& source) {
                                brk->linkEndpoints(source, ept);
                            });
                        }
                    }
                }
            }
        }
    }
    auto filts = toml::find_or(doc, "filters", uVal);
    if (!filts.is_empty()) {
        auto& filtArray = filts.as_array();
        for (const auto& filt : filtArray) {
            if (filt.is_array()) {
                auto& filtAct = filt.as_array();
                brk->addSourceFilterToEndpoint(filtAct[0].as_string(), filtAct[1].as_string());
            } else {
                std::string fname = getOrDefault(filt, "filter", std::string());
                if (!fname.empty()) {
                    auto asrc = [brk, &fname](const std::string& ept) {
                        brk->addSourceFilterToEndpoint(fname, ept);
                    };
                    addTargets(filt, "endpoints", asrc);
                    addTargets(filt, "source_endpoints", asrc);
                    addTargets(filt, "sourceEndpoints", asrc);
                    auto adst = [brk, &fname](const std::string& ept) {
                        brk->addDestinationFilterToEndpoint(fname, ept);
                    };
                    addTargets(filt, "dest_endpoints", adst);
                    addTargets(filt, "destEndpoints", adst);
                }
            }
        }
    }
    auto globals = toml::find_or(doc, "globals", uVal);
    if (!globals.is_empty()) {
        if (globals.is_array()) {
            for (auto& val : globals.as_array()) {
                brk->setGlobal(val.as_array()[0].as_string(), val.as_array()[1].as_string());
            }
        } else {
            for (const auto& val : globals.as_table()) {
                brk->setGlobal(val.first, val.second.as_string());
            }
        }
    }
    auto aliases = toml::find_or(doc, "aliases", uVal);
    if (!aliases.is_empty()) {
        if (aliases.is_array()) {
            for (auto& val : aliases.as_array()) {
                brk->addAlias(val.as_array()[0].as_string(), val.as_array()[1].as_string());
            }
        } else {
            for (const auto& val : aliases.as_table()) {
                brk->addAlias(val.first, val.second.as_string());
            }
        }
    }
}